

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCreateNodeInv(Abc_Ntk_t *pNtk,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  DdNode *pDVar3;
  Hop_Obj_t *pHVar4;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar5;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsNetlist(pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x2a4,"Abc_Obj_t *Abc_NtkCreateNodeInv(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pObj = Abc_NtkCreateNode(pNtk);
  if (pFanin != (Abc_Obj_t *)0x0) {
    Abc_ObjAddFanin(pObj,pFanin);
  }
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasBdd(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasAig(pNtk);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasMapping(pNtk);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                        ,0x2b2,"Abc_Obj_t *Abc_NtkCreateNodeInv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        pMVar5 = Mio_LibraryReadInv(pLib);
        (pObj->field_5).pData = pMVar5;
      }
      else {
        pHVar4 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0);
        pHVar4 = Hop_Not(pHVar4);
        (pObj->field_5).pData = pHVar4;
      }
    }
    else {
      pDVar3 = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0);
      (pObj->field_5).pData = (void *)((ulong)pDVar3 ^ 1);
      Cudd_Ref((DdNode *)(pObj->field_5).pData);
    }
  }
  else {
    pcVar2 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,"0 1\n");
    (pObj->field_5).pData = pcVar2;
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeInv( Abc_Ntk_t * pNtk, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    if ( pFanin ) Abc_ObjAddFanin( pNode, pFanin );
    if ( Abc_NtkHasSop(pNtk) )
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, "0 1\n" );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Cudd_Not(Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0)), Cudd_Ref( (DdNode *)pNode->pData );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_Not(Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0));
    else if ( Abc_NtkHasMapping(pNtk) )
        pNode->pData = Mio_LibraryReadInv((Mio_Library_t *)Abc_FrameReadLibGen());
    else
        assert( 0 );
    return pNode;
}